

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

bool __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<bool>
          (Deserializer *this,field_id_t field_id,char *tag,bool default_value)

{
  ulong uVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  type_conflict3 ret;
  undefined1 local_1;
  
  local_1 = (type_conflict3)(in_CL & 1);
  uVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,in_SI);
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,0);
  }
  else {
    local_1 = Read<bool>((Deserializer *)0x6745a2);
    (**(code **)(*in_RDI + 0x28))(in_RDI,1);
  }
  return local_1;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}